

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O3

void __thiscall Imf_3_4::Image::clearLevels(Image *this)

{
  long *plVar1;
  ImageLevel **ppIVar2;
  long lVar3;
  ImageLevel **ppIVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  (this->_dataWindow).min.x = 0;
  (this->_dataWindow).min.y = 0;
  (this->_dataWindow).max.x = -1;
  (this->_dataWindow).max.y = -1;
  lVar7 = (this->_levels)._sizeX;
  if (0 < lVar7) {
    lVar3 = (this->_levels)._sizeY;
    lVar8 = 0;
    lVar6 = 0;
    lVar5 = lVar3;
    do {
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          plVar1 = *(long **)((long)(this->_levels)._data + lVar7 * 8 + lVar5 * lVar8);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
            lVar3 = (this->_levels)._sizeY;
          }
          lVar7 = lVar7 + 1;
          lVar5 = lVar3;
        } while (lVar7 < lVar3);
        lVar7 = (this->_levels)._sizeX;
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar6 < lVar7);
  }
  ppIVar4 = (ImageLevel **)operator_new__(0);
  ppIVar2 = (this->_levels)._data;
  if (ppIVar2 != (ImageLevel **)0x0) {
    operator_delete__(ppIVar2);
  }
  (this->_levels)._sizeX = 0;
  (this->_levels)._sizeY = 0;
  (this->_levels)._data = ppIVar4;
  return;
}

Assistant:

void
Image::clearLevels ()
{
    _dataWindow = Box2i (V2i (0, 0), V2i (-1, -1));

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            delete _levels[y][x];

    _levels.resizeErase (0, 0);
}